

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.h
# Opt level: O0

uchar BitScanForward64(PDWORD Index,UINT64 qwMask)

{
  ulong uVar1;
  int iVar2;
  int iIndex;
  uchar bRet;
  UINT64 qwMask_local;
  PDWORD Index_local;
  
  iVar2 = 0;
  for (uVar1 = qwMask; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
    iVar2 = iVar2 + 1;
  }
  iVar2 = iVar2 + 1;
  if (qwMask == 0) {
    iVar2 = 0;
  }
  if (iVar2 != 0) {
    *Index = iVar2 - 1;
  }
  return iVar2 != 0;
}

Assistant:

unsigned char
PALAPI
BitScanForward64(
    IN OUT PDWORD Index,
    IN UINT64 qwMask)
{
    unsigned char bRet = FALSE;
    static_assert(sizeof(qwMask) <= sizeof(long long),
                  "use correct __builtin_ffs??? variant");
    int iIndex = __builtin_ffsll(qwMask);
    if (iIndex != 0)
    {
        // Set the Index after deducting unity
        *Index = (DWORD)(iIndex - 1);
        bRet = TRUE;
    }

    return bRet;
}